

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          CappedArray<char,_14UL> *params_1,ArrayPtr<const_char> *params_2,
          ArrayPtr<const_char> *params_3)

{
  size_t sVar1;
  char *__n;
  char *__dest;
  
  heapString(__return_storage_ptr__,
             (size_t)(params->ptr +
                     *(long *)(this + 8) + *(long *)params_1->content + params_2->size_));
  __dest = (char *)(__return_storage_ptr__->content).size_;
  if (__dest != (char *)0x0) {
    __dest = (__return_storage_ptr__->content).ptr;
  }
  sVar1 = *(size_t *)(this + 8);
  if (sVar1 != 0) {
    memcpy(__dest,*(void **)this,sVar1);
    __dest = __dest + sVar1;
  }
  __n = params->ptr;
  if (__n != (char *)0x0) {
    memcpy(__dest,&params->size_,(size_t)__n);
    __dest = __dest + (long)__n;
  }
  sVar1 = *(size_t *)params_1->content;
  if (sVar1 != 0) {
    memcpy(__dest,(void *)params_1->currentSize,sVar1);
    __dest = __dest + sVar1;
  }
  if (params_2->size_ != 0) {
    memcpy(__dest,params_2->ptr,params_2->size_);
  }
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}